

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O2

void __thiscall
cmGlobVerificationManager::CacheEntryKey::PrintGlobCommand
          (CacheEntryKey *this,ostream *out,string *cmdVar)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(out,"file(GLOB");
  pcVar2 = "_RECURSE ";
  if (this->Recurse == false) {
    pcVar2 = " ";
  }
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(out,(string *)cmdVar);
  std::operator<<(poVar1," ");
  if ((this->Recurse == true) && (this->FollowSymlinks == true)) {
    std::operator<<(out,"FOLLOW_SYMLINKS ");
  }
  poVar1 = std::operator<<(out,"LIST_DIRECTORIES ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1," ");
  if ((this->Relative)._M_string_length != 0) {
    poVar1 = std::operator<<(out,"RELATIVE \"");
    poVar1 = std::operator<<(poVar1,(string *)&this->Relative);
    std::operator<<(poVar1,"\" ");
  }
  poVar1 = std::operator<<(out,"\"");
  poVar1 = std::operator<<(poVar1,(string *)&this->Expression);
  std::operator<<(poVar1,"\")");
  return;
}

Assistant:

void cmGlobVerificationManager::CacheEntryKey::PrintGlobCommand(
  std::ostream& out, const std::string& cmdVar)
{
  out << "file(GLOB" << (this->Recurse ? "_RECURSE " : " ");
  out << cmdVar << " ";
  if (this->Recurse && this->FollowSymlinks) {
    out << "FOLLOW_SYMLINKS ";
  }
  out << "LIST_DIRECTORIES " << this->ListDirectories << " ";
  if (!this->Relative.empty()) {
    out << "RELATIVE \"" << this->Relative << "\" ";
  }
  out << "\"" << this->Expression << "\")";
}